

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# djpeg.c
# Opt level: O0

int parse_switches(j_decompress_ptr cinfo,int argc,char **argv,int last_file_arg_seen,
                  boolean for_real)

{
  boolean bVar1;
  int iVar2;
  FILE *__stream;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  char c;
  char ch;
  long lval;
  FILE *mapfile;
  int val;
  char *arg;
  int argn;
  JDIMENSION *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  char in_stack_ffffffffffffffb6;
  char in_stack_ffffffffffffffb7;
  char *in_stack_ffffffffffffffb8;
  undefined4 local_34;
  char *local_30;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  int local_c;
  long *local_8;
  
  requested_fmt = FMT_PPM;
  icc_filename = (char *)0x0;
  max_scans = 0;
  outfilename = (char *)0x0;
  memsrc = 0;
  report = 0;
  skip = 0;
  crop = 0;
  strict = 0;
  *(undefined4 *)(*in_RDI + 0x7c) = 0;
  local_24 = 1;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  do {
    if (local_c <= local_24) {
      return local_24;
    }
    local_30 = *(char **)(local_18 + (long)local_24 * 8);
    if (*local_30 == '-') {
      local_30 = local_30 + 1;
      bVar1 = keymatch(in_stack_ffffffffffffffb8,
                       (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                        CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0
                                                )),(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      if (bVar1 == 0) {
        bVar1 = keymatch(in_stack_ffffffffffffffb8,
                         (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                   in_stack_ffffffffffffffb0)),
                         (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
        if ((((bVar1 == 0) &&
             (bVar1 = keymatch(in_stack_ffffffffffffffb8,
                               (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                CONCAT16(in_stack_ffffffffffffffb6,
                                                         in_stack_ffffffffffffffb0)),
                               (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20)), bVar1 == 0)) &&
            (bVar1 = keymatch(in_stack_ffffffffffffffb8,
                              (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                               CONCAT16(in_stack_ffffffffffffffb6,
                                                        in_stack_ffffffffffffffb0)),
                              (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20)), bVar1 == 0)) &&
           (bVar1 = keymatch(in_stack_ffffffffffffffb8,
                             (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                              CONCAT16(in_stack_ffffffffffffffb6,
                                                       in_stack_ffffffffffffffb0)),
                             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20)), bVar1 == 0)) {
          bVar1 = keymatch(in_stack_ffffffffffffffb8,
                           (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                            CONCAT16(in_stack_ffffffffffffffb6,
                                                     in_stack_ffffffffffffffb0)),
                           (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
          if (bVar1 == 0) {
            bVar1 = keymatch(in_stack_ffffffffffffffb8,
                             (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                              CONCAT16(in_stack_ffffffffffffffb6,
                                                       in_stack_ffffffffffffffb0)),
                             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
            if (bVar1 == 0) {
              bVar1 = keymatch(in_stack_ffffffffffffffb8,
                               (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                CONCAT16(in_stack_ffffffffffffffb6,
                                                         in_stack_ffffffffffffffb0)),
                               (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
              if ((bVar1 == 0) &&
                 (bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                   (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                    CONCAT16(in_stack_ffffffffffffffb6,
                                                             in_stack_ffffffffffffffb0)),
                                   (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20)), bVar1 == 0)) {
                bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                 (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                 (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                if (bVar1 != 0) {
                  fprintf(_stderr,"%s version %s (build %s)\n","libjpeg-turbo","2.1.1","20250502");
                  exit(0);
                }
                bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                 (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                 (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                if (bVar1 == 0) {
                  bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                   (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                    CONCAT16(in_stack_ffffffffffffffb6,
                                                             in_stack_ffffffffffffffb0)),
                                   (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                  if (bVar1 == 0) {
                    bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                     (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                      CONCAT16(in_stack_ffffffffffffffb6,
                                                               in_stack_ffffffffffffffb0)),
                                     (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                    if (bVar1 == 0) {
                      bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                       (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                        CONCAT16(in_stack_ffffffffffffffb6,
                                                                 in_stack_ffffffffffffffb0)),
                                       (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                      if ((bVar1 == 0) &&
                         (bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                           (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                            CONCAT16(in_stack_ffffffffffffffb6,
                                                                     in_stack_ffffffffffffffb0)),
                                           (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20)),
                         bVar1 == 0)) {
                        bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                         (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                                   in_stack_ffffffffffffffb0)),
                                         (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                        if (bVar1 == 0) {
                          bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                           (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                            CONCAT16(in_stack_ffffffffffffffb6,
                                                                     in_stack_ffffffffffffffb0)),
                                           (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                          if (bVar1 == 0) {
                            bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                             (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                              CONCAT16(in_stack_ffffffffffffffb6,
                                                                       in_stack_ffffffffffffffb0)),
                                             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                            if (bVar1 == 0) {
                              bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                               (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                                CONCAT16(in_stack_ffffffffffffffb6,
                                                                         in_stack_ffffffffffffffb0))
                                               ,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                              if (bVar1 == 0) {
                                bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                 (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                                  CONCAT16(in_stack_ffffffffffffffb6
                                                                           ,
                                                  in_stack_ffffffffffffffb0)),
                                                 (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                if (bVar1 == 0) {
                                  bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                   (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                                    CONCAT16(
                                                  in_stack_ffffffffffffffb6,
                                                  in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                  if (bVar1 == 0) {
                                    bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                     (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                                      CONCAT16(
                                                  in_stack_ffffffffffffffb6,
                                                  in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                    if (bVar1 == 0) {
                                      bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                       (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                                        CONCAT16(
                                                  in_stack_ffffffffffffffb6,
                                                  in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                      if (bVar1 == 0) {
                                        bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                         (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                                          CONCAT16(
                                                  in_stack_ffffffffffffffb6,
                                                  in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                        if (bVar1 == 0) {
                                          bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                           (char *)CONCAT17(
                                                  in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                          if (bVar1 == 0) {
                                            bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                             (char *)CONCAT17(
                                                  in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                            if (bVar1 == 0) {
                                              bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                              if ((bVar1 == 0) &&
                                                 (bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                                   (char *)CONCAT17(
                                                  in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20)),
                                                 bVar1 == 0)) {
                                                bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                                 (char *)CONCAT17(
                                                  in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                                if (bVar1 == 0) {
                                                  bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                                   (char *)CONCAT17(
                                                  in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                                  if (bVar1 == 0) {
                                                    bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                                     (char *)CONCAT17(
                                                  in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                                  if (bVar1 == 0) {
                                                    bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                                     (char *)CONCAT17(
                                                  in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                                  if (bVar1 == 0) {
                                                    bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                                     (char *)CONCAT17(
                                                  in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                                  if (bVar1 == 0) {
                                                    bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                                                     (char *)CONCAT17(
                                                  in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                                  (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                                                  if (bVar1 == 0) {
                                                    usage();
                                                  }
                                                  else {
                                                    requested_fmt = FMT_TARGA;
                                                  }
                                                  }
                                                  else {
                                                    strict = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_24 = local_24 + 1;
                                                    if (local_c <= local_24) {
                                                      usage();
                                                    }
                                                    in_stack_ffffffffffffffa8 = &crop_y;
                                                    iVar2 = __isoc99_sscanf(*(undefined8 *)
                                                                             (local_18 +
                                                                             (long)local_24 * 8),
                                                                            "%u%c%u+%u+%u",
                                                                            &crop_width,
                                                                            &stack0xffffffffffffffb6
                                                                            ,&crop_height,&crop_x);
                                                    if (((iVar2 != 5) ||
                                                        (((in_stack_ffffffffffffffb6 != 'X' &&
                                                          (in_stack_ffffffffffffffb6 != 'x')) ||
                                                         (crop_width == 0)))) || (crop_height == 0))
                                                    {
                                                      usage();
                                                    }
                                                    crop = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_24 = local_24 + 1;
                                                    if (local_c <= local_24) {
                                                      usage();
                                                    }
                                                    iVar2 = __isoc99_sscanf(*(undefined8 *)
                                                                             (local_18 +
                                                                             (long)local_24 * 8),
                                                                            "%u,%u",&skip_start,
                                                                            &skip_end);
                                                    if ((iVar2 != 2) || (skip_end < skip_start)) {
                                                      usage();
                                                    }
                                                    skip = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_24 = local_24 + 1;
                                                    if (local_c <= local_24) {
                                                      usage();
                                                    }
                                                    iVar2 = __isoc99_sscanf(*(undefined8 *)
                                                                             (local_18 +
                                                                             (long)local_24 * 8),
                                                                            "%u/%u",(long)local_8 +
                                                                                    0x44,local_8 + 9
                                                                           );
                                                    if (iVar2 != 2) {
                                                      usage();
                                                    }
                                                  }
                                                }
                                                else {
                                                  report = 1;
                                                }
                                              }
                                              else {
                                                requested_fmt = FMT_PPM;
                                              }
                                            }
                                            else {
                                              memsrc = 1;
                                            }
                                          }
                                          else {
                                            local_24 = local_24 + 1;
                                            if (local_c <= local_24) {
                                              usage();
                                            }
                                            outfilename = *(char **)(local_18 + (long)local_24 * 8);
                                          }
                                        }
                                        else {
                                          requested_fmt = FMT_OS2;
                                        }
                                      }
                                      else {
                                        *(undefined4 *)((long)local_8 + 0x74) = 0;
                                      }
                                    }
                                    else {
                                      *(undefined4 *)((long)local_8 + 100) = 0;
                                    }
                                  }
                                  else {
                                    local_24 = local_24 + 1;
                                    if (local_c <= local_24) {
                                      usage();
                                    }
                                    iVar2 = __isoc99_sscanf(*(undefined8 *)
                                                             (local_18 + (long)local_24 * 8),"%u",
                                                            &max_scans);
                                    if (iVar2 != 1) {
                                      usage();
                                    }
                                  }
                                }
                                else {
                                  in_stack_ffffffffffffffb7 = 'x';
                                  local_24 = local_24 + 1;
                                  if (local_c <= local_24) {
                                    usage();
                                  }
                                  iVar2 = __isoc99_sscanf(*(undefined8 *)
                                                           (local_18 + (long)local_24 * 8),"%ld%c",
                                                          &stack0xffffffffffffffb8,
                                                          &stack0xffffffffffffffb7);
                                  if (iVar2 < 1) {
                                    usage();
                                  }
                                  if ((in_stack_ffffffffffffffb7 == 'm') ||
                                     (in_stack_ffffffffffffffb7 == 'M')) {
                                    in_stack_ffffffffffffffb8 =
                                         (char *)((long)in_stack_ffffffffffffffb8 * 1000);
                                  }
                                  *(long *)(local_8[1] + 0x58) =
                                       (long)in_stack_ffffffffffffffb8 * 1000;
                                }
                              }
                              else {
                                local_24 = local_24 + 1;
                                if (local_c <= local_24) {
                                  usage();
                                }
                                if (local_20 != 0) {
                                  __stream = fopen(*(char **)(local_18 + (long)local_24 * 8),"rb");
                                  if (__stream == (FILE *)0x0) {
                                    fprintf(_stderr,"%s: can\'t open %s\n",progname,
                                            *(undefined8 *)(local_18 + (long)local_24 * 8));
                                    exit(1);
                                  }
                                  read_color_map((j_decompress_ptr)
                                                 CONCAT17(in_stack_ffffffffffffffb7,
                                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                                   in_stack_ffffffffffffffb0)),
                                                 (FILE *)in_stack_ffffffffffffffa8);
                                  fclose(__stream);
                                  *(undefined4 *)((long)local_8 + 0x6c) = 1;
                                }
                              }
                            }
                            else {
                              local_24 = local_24 + 1;
                              if (local_c <= local_24) {
                                usage();
                              }
                              icc_filename = *(char **)(local_18 + (long)local_24 * 8);
                              jpeg_save_markers(local_8,0xe2,0xffff);
                            }
                          }
                          else {
                            *(undefined4 *)(local_8 + 8) = 0x10;
                          }
                        }
                        else {
                          *(undefined4 *)(local_8 + 8) = 2;
                        }
                      }
                      else {
                        *(undefined4 *)(local_8 + 8) = 1;
                      }
                    }
                    else {
                      requested_fmt = FMT_GIF0;
                    }
                  }
                  else {
                    requested_fmt = FMT_GIF;
                  }
                }
                else {
                  *(undefined4 *)((long)local_8 + 0x74) = 0;
                  *(undefined4 *)(local_8 + 0xe) = 1;
                  if (*(int *)((long)local_8 + 0x6c) == 0) {
                    *(undefined4 *)(local_8 + 0xf) = 0xd8;
                  }
                  *(undefined4 *)(local_8 + 0xc) = 1;
                  *(undefined4 *)((long)local_8 + 100) = 0;
                }
              }
              else {
                if (parse_switches::printed_version == 0) {
                  fprintf(_stderr,"%s version %s (build %s)\n","libjpeg-turbo","2.1.1","20250502");
                  fprintf(_stderr,"%s\n\n",
                          "Copyright (C) 2009-2021 D. R. Commander\nCopyright (C) 2015, 2020 Google, Inc.\nCopyright (C) 2019-2020 Arm Limited\nCopyright (C) 2015-2016, 2018 Matthieu Darbois\nCopyright (C) 2011-2016 Siarhei Siamashka\nCopyright (C) 2015 Intel Corporation\nCopyright (C) 2013-2014 Linaro Limited\nCopyright (C) 2013-2014 MIPS Technologies, Inc.\nCopyright (C) 2009, 2012 Pierre Ossman for Cendio AB\nCopyright (C) 2009-2011 Nokia Corporation and/or its subsidiary(-ies)\nCopyright (C) 1999-2006 MIYASAKA Masaru\nCopyright (C) 1991-2020 Thomas G. Lane, Guido Vollbeding"
                         );
                  fprintf(_stderr,"Emulating The Independent JPEG Group\'s software, version %s\n\n"
                          ,"6b  27-Mar-1998");
                  parse_switches::printed_version = 1;
                }
                *(int *)(*local_8 + 0x7c) = *(int *)(*local_8 + 0x7c) + 1;
              }
            }
            else {
              local_24 = local_24 + 1;
              if (local_c <= local_24) {
                usage();
              }
              bVar1 = keymatch(in_stack_ffffffffffffffb8,
                               (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                CONCAT16(in_stack_ffffffffffffffb6,
                                                         in_stack_ffffffffffffffb0)),
                               (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
              if (bVar1 == 0) {
                bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                 (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                 (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                if (bVar1 == 0) {
                  bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                   (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                    CONCAT16(in_stack_ffffffffffffffb6,
                                                             in_stack_ffffffffffffffb0)),
                                   (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                  if (bVar1 == 0) {
                    usage();
                  }
                  else {
                    *(undefined4 *)(local_8 + 0xe) = 1;
                  }
                }
                else {
                  *(undefined4 *)(local_8 + 0xe) = 0;
                }
              }
              else {
                *(undefined4 *)(local_8 + 0xe) = 2;
              }
            }
          }
          else {
            local_24 = local_24 + 1;
            if (local_c <= local_24) {
              usage();
            }
            bVar1 = keymatch(in_stack_ffffffffffffffb8,
                             (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                              CONCAT16(in_stack_ffffffffffffffb6,
                                                       in_stack_ffffffffffffffb0)),
                             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
            if (bVar1 == 0) {
              bVar1 = keymatch(in_stack_ffffffffffffffb8,
                               (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                CONCAT16(in_stack_ffffffffffffffb6,
                                                         in_stack_ffffffffffffffb0)),
                               (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
              if (bVar1 == 0) {
                bVar1 = keymatch(in_stack_ffffffffffffffb8,
                                 (char *)CONCAT17(in_stack_ffffffffffffffb7,
                                                  CONCAT16(in_stack_ffffffffffffffb6,
                                                           in_stack_ffffffffffffffb0)),
                                 (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
                if (bVar1 == 0) {
                  usage();
                }
                else {
                  *(undefined4 *)(local_8 + 0xc) = 2;
                }
              }
              else {
                *(undefined4 *)(local_8 + 0xc) = 1;
              }
            }
            else {
              *(undefined4 *)(local_8 + 0xc) = 0;
            }
          }
        }
        else {
          local_24 = local_24 + 1;
          if (local_c <= local_24) {
            usage();
          }
          iVar2 = __isoc99_sscanf(*(undefined8 *)(local_18 + (long)local_24 * 8),"%d",&local_34);
          if (iVar2 != 1) {
            usage();
          }
          *(undefined4 *)(local_8 + 0xf) = local_34;
          *(undefined4 *)((long)local_8 + 0x6c) = 1;
        }
      }
      else {
        requested_fmt = FMT_BMP;
      }
    }
    else {
      if (local_1c < local_24) {
        return local_24;
      }
      outfilename = (char *)0x0;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

LOCAL(int)
parse_switches(j_decompress_ptr cinfo, int argc, char **argv,
               int last_file_arg_seen, boolean for_real)
/* Parse optional switches.
 * Returns argv[] index of first file-name argument (== argc if none).
 * Any file names with indexes <= last_file_arg_seen are ignored;
 * they have presumably been processed in a previous iteration.
 * (Pass 0 for last_file_arg_seen on the first or only iteration.)
 * for_real is FALSE on the first (dummy) pass; we may skip any expensive
 * processing.
 */
{
  int argn;
  char *arg;

  /* Set up default JPEG parameters. */
  requested_fmt = DEFAULT_FMT;  /* set default output file format */
  icc_filename = NULL;
  max_scans = 0;
  outfilename = NULL;
  memsrc = FALSE;
  report = FALSE;
  skip = FALSE;
  crop = FALSE;
  strict = FALSE;
  cinfo->err->trace_level = 0;

  /* Scan command line options, adjust parameters */

  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (*arg != '-') {
      /* Not a switch, must be a file name argument */
      if (argn <= last_file_arg_seen) {
        outfilename = NULL;     /* -outfile applies to just one input file */
        continue;               /* ignore this name if previously processed */
      }
      break;                    /* else done parsing switches */
    }
    arg++;                      /* advance past switch marker character */

    if (keymatch(arg, "bmp", 1)) {
      /* BMP output format (Windows flavor). */
      requested_fmt = FMT_BMP;

    } else if (keymatch(arg, "colors", 1) || keymatch(arg, "colours", 1) ||
               keymatch(arg, "quantize", 1) || keymatch(arg, "quantise", 1)) {
      /* Do color quantization. */
      int val;

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%d", &val) != 1)
        usage();
      cinfo->desired_number_of_colors = val;
      cinfo->quantize_colors = TRUE;

    } else if (keymatch(arg, "dct", 2)) {
      /* Select IDCT algorithm. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "int", 1)) {
        cinfo->dct_method = JDCT_ISLOW;
      } else if (keymatch(argv[argn], "fast", 2)) {
        cinfo->dct_method = JDCT_IFAST;
      } else if (keymatch(argv[argn], "float", 2)) {
        cinfo->dct_method = JDCT_FLOAT;
      } else
        usage();

    } else if (keymatch(arg, "dither", 2)) {
      /* Select dithering algorithm. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "fs", 2)) {
        cinfo->dither_mode = JDITHER_FS;
      } else if (keymatch(argv[argn], "none", 2)) {
        cinfo->dither_mode = JDITHER_NONE;
      } else if (keymatch(argv[argn], "ordered", 2)) {
        cinfo->dither_mode = JDITHER_ORDERED;
      } else
        usage();

    } else if (keymatch(arg, "debug", 1) || keymatch(arg, "verbose", 1)) {
      /* Enable debug printouts. */
      /* On first -d, print version identification */
      static boolean printed_version = FALSE;

      if (!printed_version) {
        fprintf(stderr, "%s version %s (build %s)\n",
                PACKAGE_NAME, VERSION, BUILD);
        fprintf(stderr, "%s\n\n", JCOPYRIGHT);
        fprintf(stderr, "Emulating The Independent JPEG Group's software, version %s\n\n",
                JVERSION);
        printed_version = TRUE;
      }
      cinfo->err->trace_level++;

    } else if (keymatch(arg, "version", 4)) {
      fprintf(stderr, "%s version %s (build %s)\n",
              PACKAGE_NAME, VERSION, BUILD);
      exit(EXIT_SUCCESS);

    } else if (keymatch(arg, "fast", 1)) {
      /* Select recommended processing options for quick-and-dirty output. */
      cinfo->two_pass_quantize = FALSE;
      cinfo->dither_mode = JDITHER_ORDERED;
      if (!cinfo->quantize_colors) /* don't override an earlier -colors */
        cinfo->desired_number_of_colors = 216;
      cinfo->dct_method = JDCT_FASTEST;
      cinfo->do_fancy_upsampling = FALSE;

    } else if (keymatch(arg, "gif", 1)) {
      /* GIF output format (LZW-compressed). */
      requested_fmt = FMT_GIF;

    } else if (keymatch(arg, "gif0", 4)) {
      /* GIF output format (uncompressed). */
      requested_fmt = FMT_GIF0;

    } else if (keymatch(arg, "grayscale", 2) ||
               keymatch(arg, "greyscale", 2)) {
      /* Force monochrome output. */
      cinfo->out_color_space = JCS_GRAYSCALE;

    } else if (keymatch(arg, "rgb", 2)) {
      /* Force RGB output. */
      cinfo->out_color_space = JCS_RGB;

    } else if (keymatch(arg, "rgb565", 2)) {
      /* Force RGB565 output. */
      cinfo->out_color_space = JCS_RGB565;

    } else if (keymatch(arg, "icc", 1)) {
      /* Set ICC filename. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      icc_filename = argv[argn];
      jpeg_save_markers(cinfo, JPEG_APP0 + 2, 0xFFFF);

    } else if (keymatch(arg, "map", 3)) {
      /* Quantize to a color map taken from an input file. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (for_real) {           /* too expensive to do twice! */
#ifdef QUANT_2PASS_SUPPORTED    /* otherwise can't quantize to supplied map */
        FILE *mapfile;

        if ((mapfile = fopen(argv[argn], READ_BINARY)) == NULL) {
          fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
          exit(EXIT_FAILURE);
        }
        read_color_map(cinfo, mapfile);
        fclose(mapfile);
        cinfo->quantize_colors = TRUE;
#else
        ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
      }

    } else if (keymatch(arg, "maxmemory", 3)) {
      /* Maximum memory in Kb (or Mb with 'm'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (ch == 'm' || ch == 'M')
        lval *= 1000L;
      cinfo->mem->max_memory_to_use = lval * 1000L;

    } else if (keymatch(arg, "maxscans", 4)) {
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%u", &max_scans) != 1)
        usage();

    } else if (keymatch(arg, "nosmooth", 3)) {
      /* Suppress fancy upsampling */
      cinfo->do_fancy_upsampling = FALSE;

    } else if (keymatch(arg, "onepass", 3)) {
      /* Use fast one-pass quantization. */
      cinfo->two_pass_quantize = FALSE;

    } else if (keymatch(arg, "os2", 3)) {
      /* BMP output format (OS/2 flavor). */
      requested_fmt = FMT_OS2;

    } else if (keymatch(arg, "outfile", 4)) {
      /* Set output file name. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      outfilename = argv[argn]; /* save it away for later use */

    } else if (keymatch(arg, "memsrc", 2)) {
      /* Use in-memory source manager */
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
      memsrc = TRUE;
#else
      fprintf(stderr, "%s: sorry, in-memory source manager was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "pnm", 1) || keymatch(arg, "ppm", 1)) {
      /* PPM/PGM output format. */
      requested_fmt = FMT_PPM;

    } else if (keymatch(arg, "report", 2)) {
      report = TRUE;

    } else if (keymatch(arg, "scale", 2)) {
      /* Scale the output image by a fraction M/N. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%u/%u",
                 &cinfo->scale_num, &cinfo->scale_denom) != 2)
        usage();

    } else if (keymatch(arg, "skip", 2)) {
      if (++argn >= argc)
        usage();
      if (sscanf(argv[argn], "%u,%u", &skip_start, &skip_end) != 2 ||
          skip_start > skip_end)
        usage();
      skip = TRUE;

    } else if (keymatch(arg, "crop", 2)) {
      char c;
      if (++argn >= argc)
        usage();
      if (sscanf(argv[argn], "%u%c%u+%u+%u", &crop_width, &c, &crop_height,
                 &crop_x, &crop_y) != 5 ||
          (c != 'X' && c != 'x') || crop_width < 1 || crop_height < 1)
        usage();
      crop = TRUE;

    } else if (keymatch(arg, "strict", 2)) {
      strict = TRUE;

    } else if (keymatch(arg, "targa", 1)) {
      /* Targa output format. */
      requested_fmt = FMT_TARGA;

    } else {
      usage();                  /* bogus switch */
    }
  }

  return argn;                  /* return index of next arg (file name) */
}